

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

void __thiscall sznet::net::Connector::stopInLoop(Connector *this)

{
  sz_sock sockfd_00;
  sz_sock sockfd;
  Connector *this_local;
  
  EventLoop::assertInLoopThread(this->m_loop);
  if (this->m_state == kConnecting) {
    setState(this,kDisconnected);
    sockfd_00 = removeAndResetChannel(this);
    retry(this,sockfd_00);
  }
  return;
}

Assistant:

void Connector::stopInLoop()
{
	m_loop->assertInLoopThread();
	if (m_state == kConnecting)
	{
		setState(kDisconnected);
		sockets::sz_sock sockfd = removeAndResetChannel();
		retry(sockfd);
	}
}